

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::ArenaTest_StartingBlockSize_Test::TestBody(ArenaTest_StartingBlockSize_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  AllocationPolicy res;
  ArenaOptions options;
  Arena custom_arena;
  Arena default_arena;
  AssertHelper local_1b8;
  undefined1 local_1b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  _func_void_ptr_size_t *local_1a0;
  _func_void_void_ptr_size_t *p_Stack_198;
  AssertHelper local_190;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  void *local_178;
  size_t sStack_170;
  _func_void_ptr_size_t *local_168;
  _func_void_void_ptr_size_t *p_Stack_160;
  undefined1 local_158 [8];
  TaggedAllocationPolicyPtr local_150;
  ThreadSafeArena local_b0;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_b0);
  local_1b0 = (undefined1  [8])((ulong)(uint)local_1b0._4_4_ << 0x20);
  local_188._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       protobuf::internal::ThreadSafeArena::SpaceAllocated(&local_b0);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_158,"0","default_arena.SpaceAllocated()",(int *)local_1b0,
             (unsigned_long *)&local_188);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150.policy_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = *(char **)local_150.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x6a7,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1b0,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b0);
    if (local_188._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150.policy_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_150.policy_);
  }
  Arena::AllocateForArray((Arena *)&local_b0,8);
  local_188._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x100;
  local_180 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00008000;
  local_178 = (void *)0x0;
  sStack_170 = 0;
  local_168 = (_func_void_ptr_size_t *)0x0;
  p_Stack_160 = (_func_void_void_ptr_size_t *)0x0;
  local_1b0 = (undefined1  [8])protobuf::internal::ThreadSafeArena::SpaceAllocated(&local_b0);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_158,"default_arena.SpaceAllocated()","options.start_block_size",
             (unsigned_long *)local_1b0,(unsigned_long *)&local_188);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1b0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150.policy_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = *(char **)local_150.policy_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x6ad,pcVar1);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    if (local_1b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_1b0 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150.policy_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_150.policy_);
  }
  local_1b0 = (undefined1  [8])((long)local_188._M_head_impl * 2);
  local_1a8 = local_180;
  local_1a0 = local_168;
  p_Stack_198 = p_Stack_160;
  local_188._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0;
  protobuf::internal::ThreadSafeArena::ThreadSafeArena
            ((ThreadSafeArena *)local_158,local_178,sStack_170,(AllocationPolicy *)local_1b0);
  Arena::AllocateForArray((Arena *)local_158,8);
  local_1b8.data_ =
       (AssertHelperData *)
       protobuf::internal::ThreadSafeArena::SpaceAllocated((ThreadSafeArena *)local_158);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1b0,"custom_arena.SpaceAllocated()","options.start_block_size",
             (unsigned_long *)&local_1b8,(unsigned_long *)&local_188);
  if (local_1b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b8);
    if (local_1a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar1 = (local_1a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x6b3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_1b8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_1b8.data_ + 8))();
    }
  }
  if (local_1a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1a8,local_1a8);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena((ThreadSafeArena *)local_158);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_b0);
  return;
}

Assistant:

TEST(ArenaTest, StartingBlockSize) {
  Arena default_arena;
  EXPECT_EQ(0, default_arena.SpaceAllocated());

  // Allocate something to get starting block size.
  Arena::CreateArray<char>(&default_arena, 1);
  ArenaOptions options;
  // First block size should be the default starting block size.
  EXPECT_EQ(default_arena.SpaceAllocated(), options.start_block_size);

  // Use a custom starting block size.
  options.start_block_size *= 2;
  Arena custom_arena(options);
  Arena::CreateArray<char>(&custom_arena, 1);
  EXPECT_EQ(custom_arena.SpaceAllocated(), options.start_block_size);
}